

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O2

void route_anything(t_route *x,t_symbol *sel,int argc,t_atom *argv)

{
  _outlet **pp_Var1;
  int iVar2;
  bool bVar3;
  
  if (x->x_type == A_SYMBOL) {
    iVar2 = x->x_nelement;
    pp_Var1 = &x->x_vec->e_outlet;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      if ((((t_routeelement *)(pp_Var1 + -1))->e_w).w_symbol == sel) {
        if ((0 < argc) && (argv->a_type == A_SYMBOL)) {
          outlet_anything(*pp_Var1,(argv->a_w).w_symbol,argc + -1,argv + 1);
          return;
        }
        outlet_list(*pp_Var1,(t_symbol *)0x0,argc,argv);
        return;
      }
      pp_Var1 = pp_Var1 + 2;
    }
  }
  outlet_anything(x->x_rejectout,sel,argc,argv);
  return;
}

Assistant:

static void route_anything(t_route *x, t_symbol *sel, int argc, t_atom *argv)
{
    t_routeelement *e;
    int nelement;
    if (x->x_type == A_SYMBOL)
    {
        for (nelement = x->x_nelement, e = x->x_vec; nelement--; e++)
            if (e->e_w.w_symbol == sel)
        {
            if (argc > 0 && argv[0].a_type == A_SYMBOL)
                outlet_anything(e->e_outlet, argv[0].a_w.w_symbol,
                    argc-1, argv+1);
            else outlet_list(e->e_outlet, 0, argc, argv);
            return;
        }
    }
    outlet_anything(x->x_rejectout, sel, argc, argv);
}